

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O0

void __thiscall
wabt::Decompiler::LoadStore
          (Decompiler *this,Value *val,Node *addr_exp,uint64_t offset,Opcode opc,Address align,
          Type op_type)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_> *pvVar1;
  bool bVar2;
  Enum EVar3;
  uint32_t uVar4;
  ulong uVar5;
  reference pvVar6;
  vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_> *pvVar7;
  reference ppDVar8;
  reference e;
  OpcodeExpr<(wabt::ExprType)7> *pOVar9;
  const_reference pvVar10;
  const_reference pvVar11;
  ConstExpr *pCVar12;
  size_type sVar13;
  Opcode OVar14;
  undefined4 in_register_00000084;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d0;
  string local_2a8;
  Enum local_284;
  Type local_280;
  Type local_278;
  char *local_270;
  string local_268;
  string local_248;
  Value local_228;
  string local_208;
  undefined1 local_1e8 [8];
  Value ival;
  ConstExpr *ce;
  value_type *const_exp;
  OpcodeExpr<(wabt::ExprType)7> *se;
  value_type *shift_exp;
  OpcodeExpr<(wabt::ExprType)7> *pe;
  string local_190;
  byte local_169;
  string local_168;
  undefined1 local_148 [8];
  string index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  iterator local_100;
  size_type local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  Value local_d8;
  vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_> *local_b8;
  uint64_t dat_base;
  DataSegment *dat;
  const_iterator __end3;
  const_iterator __begin3;
  vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_> *__range3;
  uint64_t abs_base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string access;
  bool append_type;
  Address align_local;
  uint64_t offset_local;
  Node *addr_exp_local;
  Value *val_local;
  Decompiler *this_local;
  Opcode opc_local;
  
  access.field_2._M_local_buf[0xf] = '\x01';
  OVar14.enum_ = opc.enum_;
  LoadStoreTracking::GenAccess_abi_cxx11_((string *)local_60,&this->lst,offset,addr_exp);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_60,"*");
    if (!bVar2) {
      BracketIfNeeded(this,val,Indexing);
      std::operator+(&local_80,".",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(&val->v);
      std::__cxx11::string::operator+=((string *)pvVar6,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      abs_base._4_4_ = 1;
      goto LAB_001ae704;
    }
    access.field_2._M_local_buf[0xf] = '\0';
  }
  bVar2 = ConstIntVal(this,addr_exp->e,(uint64_t *)&__range3);
  align_local = offset;
  if (bVar2) {
    __range3 = (vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_> *)
               ((long)&(__range3->
                       super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                       )._M_impl.super__Vector_impl_data._M_start + offset);
    pvVar7 = &((this->mc).module)->data_segments;
    __end3 = std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>::begin(pvVar7);
    dat = (DataSegment *)
          std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>::end(pvVar7);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<wabt::DataSegment_*const_*,_std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>_>
                                       *)&dat), bVar2) {
      ppDVar8 = __gnu_cxx::
                __normal_iterator<wabt::DataSegment_*const_*,_std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>_>
                ::operator*(&__end3);
      dat_base = (uint64_t)*ppDVar8;
      sVar13 = intrusive_list<wabt::Expr>::size(&((DataSegment *)dat_base)->offset);
      if (sVar13 == 1) {
        e = intrusive_list<wabt::Expr>::front((intrusive_list<wabt::Expr> *)(dat_base + 0x70));
        bVar2 = ConstIntVal(this,e,(uint64_t *)&local_b8);
        pvVar1 = __range3;
        pvVar7 = local_b8;
        if (((bVar2) && (local_b8 <= __range3)) &&
           (sVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                (dat_base + 0x88)),
           pvVar1 < (vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_> *)
                    ((long)&(pvVar7->
                            super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                            )._M_impl.super__Vector_impl_data._M_start + sVar13))) {
          std::__cxx11::string::string((string *)&local_120,(string *)(dat_base + 8));
          local_100 = &local_120;
          local_f8 = 1;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(index.field_2._M_local_buf + 0xf));
          __l._M_len = local_f8;
          __l._M_array = local_100;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_f0,__l,(allocator_type *)(index.field_2._M_local_buf + 0xf));
          Value::Value(&local_d8,&local_f0,Atomic);
          Value::operator=(val,&local_d8);
          Value::~Value(&local_d8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_f0);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(index.field_2._M_local_buf + 0xf));
          local_2d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_100;
          do {
            local_2d0 = local_2d0 + -1;
            std::__cxx11::string::~string((string *)local_2d0);
          } while (local_2d0 != &local_120);
          align_local = (long)__range3 - (long)local_b8;
        }
      }
      __gnu_cxx::
      __normal_iterator<wabt::DataSegment_*const_*,_std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>_>
      ::operator++(&__end3);
    }
  }
  local_169 = 0;
  if (align_local % align == 0) {
    std::__cxx11::to_string((string *)local_148,align_local / align);
  }
  else {
    std::__cxx11::to_string(&local_168,align_local);
    local_169 = 1;
    std::__cxx11::to_string(&local_190,align);
    cat<std::__cxx11::string,char[2],std::__cxx11::string>
              ((string *)local_148,(wabt *)&local_168,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"@",
               (char (*) [2])&local_190,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_register_00000084,OVar14.enum_));
    std::__cxx11::string::~string((string *)&local_190);
  }
  if ((local_169 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_168);
  }
  if (addr_exp->etype == Binary) {
    pOVar9 = cast<wabt::OpcodeExpr<(wabt::ExprType)7>,wabt::Expr>(addr_exp->e);
    pvVar10 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::operator[]
                        (&addr_exp->children,1);
    EVar3 = Opcode::operator_cast_to_Enum(&pOVar9->opcode);
    if ((EVar3 == I32Add) && (pvVar10->etype == Binary)) {
      pOVar9 = cast<wabt::OpcodeExpr<(wabt::ExprType)7>,wabt::Expr>(pvVar10->e);
      pvVar11 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::operator[]
                          (&pvVar10->children,1);
      EVar3 = Opcode::operator_cast_to_Enum(&pOVar9->opcode);
      if ((EVar3 == I32Shl) && (pvVar11->etype == Const)) {
        pCVar12 = cast<wabt::ConstExpr,wabt::Expr>(pvVar11->e);
        ival._24_8_ = Const::type(&pCVar12->const_);
        bVar2 = wabt::operator==((Type)ival._24_8_,I32);
        if ((bVar2) && (uVar4 = Const::u32(&pCVar12->const_), 1L << ((byte)uVar4 & 0x3f) == align))
        {
          pvVar11 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::operator[]
                              (&pvVar10->children,0);
          DecompileExpr((Value *)local_1e8,this,pvVar11,pvVar10);
          sVar13 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_1e8);
          if (sVar13 == 1) {
            if (align_local == 0) {
              pvVar6 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_1e8,0);
              std::__cxx11::string::operator=((string *)local_148,(string *)pvVar6);
            }
            else {
              BracketIfNeeded(this,(Value *)local_1e8,Add);
              pvVar6 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_1e8,0);
              cat<std::__cxx11::string,char[4],std::__cxx11::string>
                        (&local_208,(wabt *)pvVar6,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" + ",
                         (char (*) [4])local_148,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_register_00000084,OVar14.enum_));
              std::__cxx11::string::operator=((string *)local_148,(string *)&local_208);
              std::__cxx11::string::~string((string *)&local_208);
            }
            pvVar10 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::operator[]
                                (&addr_exp->children,0);
            DecompileExpr(&local_228,this,pvVar10,addr_exp);
            Value::operator=(val,&local_228);
            Value::~Value(&local_228);
          }
          Value::~Value((Value *)local_1e8);
        }
      }
    }
  }
  BracketIfNeeded(this,val,Indexing);
  cat<char[2],std::__cxx11::string,char[2]>
            (&local_248,(wabt *)0x214c1f,(char (*) [2])local_148,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20aabd,
             (char (*) [2])CONCAT44(in_register_00000084,OVar14.enum_));
  pvVar6 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::back(&val->v);
  std::__cxx11::string::operator+=((string *)pvVar6,(string *)&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  if ((access.field_2._M_local_buf[0xf] & 1U) != 0) {
    local_280 = op_type;
    local_284 = opc.enum_;
    local_278 = GetMemoryType(op_type,opc);
    local_270 = GetDecompTypeName(local_278);
    LoadStoreTracking::GenAlign_abi_cxx11_(&local_2a8,&this->lst,align,opc);
    cat<char[2],char_const*,std::__cxx11::string>
              (&local_268,(wabt *)":",(char (*) [2])&local_270,(char **)&local_2a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_register_00000084,OVar14.enum_));
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back(&val->v);
    std::__cxx11::string::operator+=((string *)pvVar6,(string *)&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  val->precedence = Indexing;
  std::__cxx11::string::~string((string *)local_148);
  abs_base._4_4_ = 0;
LAB_001ae704:
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void LoadStore(Value& val,
                 const Node& addr_exp,
                 uint64_t offset,
                 Opcode opc,
                 Address align,
                 Type op_type) {
    bool append_type = true;
    auto access = lst.GenAccess(offset, addr_exp);
    if (!access.empty()) {
      if (access == "*") {
        // The variable was declared as a typed pointer, so this access
        // doesn't need a type.
        append_type = false;
      } else {
        // We can do this load/store as a struct access.
        BracketIfNeeded(val, Precedence::Indexing);
        val.v.back() += "." + access;
        return;
      }
    }
    // Detect absolute addressing, which we try to turn into references to the
    // data section when possible.
    uint64_t abs_base;
    if (ConstIntVal(addr_exp.e, abs_base)) {
      // We don't care what part of the absolute address was stored where,
      // 1[0] and 0[1] are the same.
      abs_base += offset;
      // FIXME: make this less expensive with a binary search or whatever.
      for (auto dat : mc.module.data_segments) {
        uint64_t dat_base;
        if (dat->offset.size() == 1 &&
            ConstIntVal(&dat->offset.front(), dat_base) &&
            abs_base >= dat_base && abs_base < dat_base + dat->data.size()) {
          // We are inside the range of this data segment!
          // Turn expression into data_name[index]
          val = Value{{dat->name}, Precedence::Atomic};
          // The new offset is from the start of the data segment, instead of
          // whatever it was.. this may be a different value from both the
          // original const and offset!
          offset = abs_base - dat_base;
        }
      }
    }
    // Do the load/store as a generalized indexing operation.
    // The offset is divisible by the alignment in 99.99% of
    // cases, but the spec doesn't guarantee it, so we must
    // have a backup syntax.
    auto index = offset % align == 0
                     ? std::to_string(offset / align)
                     : cat(std::to_string(offset), "@", std::to_string(align));
    // Detect the very common case of (base + (index << 2))[0]:int etc.
    // so we can instead do base[index]:int
    // TODO: (index << 2) on the left of + occurs also.
    // TODO: sadly this does not address cases where the shift amount > align.
    // (which happens for arrays of structs or arrays of long (with align=4)).
    // TODO: also very common is (v = base + (index << 2))[0]:int
    if (addr_exp.etype == ExprType::Binary) {
      auto& pe = *cast<BinaryExpr>(addr_exp.e);
      auto& shift_exp = addr_exp.children[1];
      if (pe.opcode == Opcode::I32Add && shift_exp.etype == ExprType::Binary) {
        auto& se = *cast<BinaryExpr>(shift_exp.e);
        auto& const_exp = shift_exp.children[1];
        if (se.opcode == Opcode::I32Shl && const_exp.etype == ExprType::Const) {
          auto& ce = *cast<ConstExpr>(const_exp.e);
          if (ce.const_.type() == Type::I32 &&
              (1ULL << ce.const_.u32()) == align) {
            // Pfew, case detected :( Lets re-write this in Haskell.
            // TODO: we're decompiling these twice.
            // The thing to the left of << is going to be part of the index.
            auto ival = DecompileExpr(shift_exp.children[0], &shift_exp);
            if (ival.v.size() == 1) {  // Don't bother if huge.
              if (offset == 0) {
                index = ival.v[0];
              } else {
                BracketIfNeeded(ival, Precedence::Add);
                index = cat(ival.v[0], " + ", index);
              }
              // We're going to use the thing to the left of + as the new
              // base address:
              val = DecompileExpr(addr_exp.children[0], &addr_exp);
            }
          }
        }
      }
    }
    BracketIfNeeded(val, Precedence::Indexing);
    val.v.back() += cat("[", index, "]");
    if (append_type) {
      val.v.back() += cat(":", GetDecompTypeName(GetMemoryType(op_type, opc)),
                          lst.GenAlign(align, opc));
    }
    val.precedence = Precedence::Indexing;
  }